

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

string * __thiscall
sqlite_orm::internal::
table_t<relive::Track,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>
::find_column_name<long,relive::Track,void>
          (string *__return_storage_ptr__,void *this,offset_in_Track_to_long m)

{
  iterator<6ul,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>
  local_31;
  anon_class_8_1_54a3980c local_30;
  anon_class_16_2_de34c1f6 local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_30.l = &local_28;
  local_28.res = __return_storage_ptr__;
  local_28.m = m;
  tuple_helper::
  iterator<6ul,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>
  ::operator()(&local_31,
               (tuple<sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,_std::tuple<long_relive::Stream::*>_>_>
                *)((long)this + 0x28),&local_30,false);
  return __return_storage_ptr__;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }